

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
 __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::extract
          (intrusive_list<(anonymous_namespace)::TestObject> *this,iterator pos)

{
  bool bVar1;
  reference __p;
  intrusive_list<(anonymous_namespace)::TestObject> *this_00;
  iterator rhs;
  TestObject *node;
  intrusive_list<(anonymous_namespace)::TestObject> *this_local;
  iterator pos_local;
  
  this_local = (intrusive_list<(anonymous_namespace)::TestObject> *)pos.node_;
  this_00 = pos.list_;
  pos_local.node_ = (TestObject *)this;
  bVar1 = empty(this_00);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                  ,0x223,
                  "std::unique_ptr<T> wabt::intrusive_list<(anonymous namespace)::TestObject>::extract(iterator) [T = (anonymous namespace)::TestObject]"
                 );
  }
  rhs = end(this_00);
  bVar1 = iterator::operator!=((iterator *)&this_local,rhs);
  if (bVar1) {
    __p = iterator::operator*((iterator *)&this_local);
    if (this_00->first_ == this_00->last_) {
      this_00->last_ = (TestObject *)0x0;
      this_00->first_ = (TestObject *)0x0;
    }
    else {
      if ((__p->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ ==
          (TestObject *)0x0) {
        this_00->first_ = (__p->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
      }
      else {
        (((__p->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_)->
        super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
             (__p->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
      }
      if ((__p->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ ==
          (TestObject *)0x0) {
        this_00->last_ = (__p->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
      }
      else {
        (((__p->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_)->
        super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
             (__p->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
      }
    }
    (__p->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = (TestObject *)0x0;
    (__p->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = (TestObject *)0x0;
    this_00->size_ = this_00->size_ - 1;
    std::
    unique_ptr<(anonymous_namespace)::TestObject,std::default_delete<(anonymous_namespace)::TestObject>>
    ::unique_ptr<std::default_delete<(anonymous_namespace)::TestObject>,void>
              ((unique_ptr<(anonymous_namespace)::TestObject,std::default_delete<(anonymous_namespace)::TestObject>>
                *)this,__p);
    return (__uniq_ptr_data<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>,_true,_true>
              )this;
  }
  __assert_fail("pos != end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                ,0x224,
                "std::unique_ptr<T> wabt::intrusive_list<(anonymous namespace)::TestObject>::extract(iterator) [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

inline std::unique_ptr<T> intrusive_list<T>::extract(iterator pos) {
  assert(!empty());
  assert(pos != end());
  T* node = &*pos;
  if (first_ == last_) {
    first_ = last_ = nullptr;
  } else {
    if (node->prev_) {
      node->prev_->next_ = node->next_;
    } else {
      first_ = node->next_;
    }

    if (node->next_) {
      node->next_->prev_ = node->prev_;
    } else {
      last_ = node->prev_;
    }
  }
  node->next_ = node->prev_ = nullptr;
  size_--;
  return std::unique_ptr<T>(node);
}